

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O0

int GetHealthRequestRPLIDAR(RPLIDAR *pRPLIDAR,BOOL *pbProtectionStop)

{
  int iVar1;
  int local_34 [2];
  int DataType;
  int SendMode;
  int DataResponseLength;
  uchar databuf [3];
  uint *puStack_20;
  uchar reqbuf [2];
  BOOL *pbProtectionStop_local;
  RPLIDAR *pRPLIDAR_local;
  
  DataResponseLength._2_2_ = 0x52a5;
  DataType = 0;
  local_34[1] = 0;
  local_34[0] = 0;
  puStack_20 = (uint *)pbProtectionStop;
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)((long)&DataResponseLength + 2),2);
  if (iVar1 == 0) {
    iVar1 = GetResponseDescriptorRPLIDAR(pRPLIDAR,&DataType,local_34 + 1,local_34);
    if (iVar1 == 0) {
      if ((DataType == 3) && (local_34[0] == 6)) {
        memset((void *)((long)&SendMode + 3),0,3);
        iVar1 = ReadAllRS232Port(&pRPLIDAR->RS232Port,(uint8 *)((long)&SendMode + 3),3);
        if (iVar1 == 0) {
          *puStack_20 = (uint)(SendMode._3_1_ == '\x02');
          pRPLIDAR_local._4_4_ = 0;
        }
        else {
          printf("A RPLIDAR is not responding correctly. \n");
          pRPLIDAR_local._4_4_ = 1;
        }
      }
      else {
        printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
        pRPLIDAR_local._4_4_ = 1;
      }
    }
    else {
      pRPLIDAR_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a RPLIDAR. \n");
    pRPLIDAR_local._4_4_ = 1;
  }
  return pRPLIDAR_local._4_4_;
}

Assistant:

inline int GetHealthRequestRPLIDAR(RPLIDAR* pRPLIDAR, BOOL* pbProtectionStop)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
    sl_lidar_response_device_health_t healthinfo;

	if (SL_IS_FAIL(pRPLIDAR->drv->getHealth(healthinfo)))
	{
		printf("A RPLIDAR is not responding correctly : getHealth() failed. \n");
		return EXIT_FAILURE;
	}

	// Analyze the data response.
	*pbProtectionStop = (healthinfo.status == SL_LIDAR_STATUS_ERROR)? TRUE: FALSE;
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,GET_HEALTH_REQUEST_RPLIDAR};
	unsigned char databuf[3];
	int DataResponseLength = 0, SendMode = 0, DataType = 0;

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}

	// Receive the response descriptor.
	if (GetResponseDescriptorRPLIDAR(pRPLIDAR, &DataResponseLength, &SendMode, &DataType) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	// Quick check of the response descriptor.
	if ((DataResponseLength != 3)||(DataType != DEVHEALTH_RESPONSE_RPLIDAR))
	{ 
		printf("A RPLIDAR is not responding correctly : Bad response descriptor. \n");
		return EXIT_FAILURE;	
	}

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	if (ReadAllRS232Port(&pRPLIDAR->RS232Port, databuf, sizeof(databuf)) != EXIT_SUCCESS)
	{ 
		printf("A RPLIDAR is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// Analyze the data response.
	*pbProtectionStop = (databuf[0] == STATUS_ERROR_RPLIDAR)? TRUE: FALSE;
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}